

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::effective_value_test::test_method(effective_value_test *this)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *this_00;
  long lVar1;
  optional<CFeeRate> feerate;
  optional<CFeeRate> feerate_00;
  optional<CFeeRate> feerate_01;
  reference pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  CAmount expected_ev3;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  CAmount expected_ev1;
  CMutableTransaction tx;
  CAmount nValue;
  undefined8 local_3d8;
  undefined1 uStack_3d0;
  undefined7 uStack_3cf;
  undefined8 local_3c8;
  undefined1 uStack_3c0;
  undefined7 uStack_3bf;
  undefined8 local_3b8;
  undefined1 uStack_3b0;
  undefined7 uStack_3af;
  _Storage<long,_true> local_3a8;
  ulong uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  _Storage<long,_true> local_388;
  ulong uStack_380;
  _Storage<long,_true> local_378;
  char *pcStack_370;
  undefined4 local_368;
  COutput output5;
  COutput output4;
  COutput output3;
  COutput output2;
  COutput output1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nValue = 10000;
  CMutableTransaction::CMutableTransaction(&tx);
  this_00 = &tx.vout;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(this_00,1);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 10000;
  CMutableTransaction::GetHash((Txid *)&output3,&tx);
  output2.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
  output2.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
  output2.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _9_7_ = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._9_7_;
  output2.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload =
       output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  output2.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged =
       output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  output2.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._9_7_ =
       output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._9_7_;
  output2.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  output2.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  output2.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  output2.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(this_00,0);
  local_3b8 = 1000;
  uStack_3b0 = 1;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._9_7_ = uStack_3af;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  pvVar3 = (iterator)0x94;
  pvVar4 = &DAT_00000001;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)0x3e8;
  COutput::COutput(&output1,(COutPoint *)&output2,pvVar2,1,0x94,true,true,true,0,false,feerate);
  expected_ev1 = 0x267c;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x434;
  file.m_begin = (iterator)&local_430;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_440,msg);
  output2.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ =
       output2.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._8_8_ & 0xffffffffffffff00;
  output2.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_011480b0;
  output2.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = (long)boost::unit_test::lazy_ostream::inst;
  output2.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_448 = "";
  output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = COutput::GetEffectiveValue(&output1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&output2,&local_450,0x434,1,2,&output3,"output1.GetEffectiveValue()",&expected_ev1,
             "expected_ev1");
  CMutableTransaction::GetHash((Txid *)&output4,&tx);
  output3.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = output4.fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
  output3.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = output4.fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
  output3.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _9_7_ = output4.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._9_7_;
  output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload =
       output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged =
       output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._9_7_ =
       output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._9_7_;
  output3.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  output3.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  output3.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  output3.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(this_00,0);
  local_3c8 = 1000;
  uStack_3c0 = 1;
  feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._9_7_ = uStack_3bf;
  feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  pvVar3 = (iterator)0xffffffffffffffff;
  pvVar4 = &DAT_00000001;
  feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)0x3e8;
  COutput::COutput(&output2,(COutPoint *)&output3,pvVar2,1,-1,true,true,true,0,false,feerate_00);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x438;
  file_00.m_begin = (iterator)&local_460;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_470,
             msg_00);
  output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ =
       output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._8_8_ & 0xffffffffffffff00;
  output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_011480b0;
  output3.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = (long)boost::unit_test::lazy_ostream::inst;
  output3.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_478 = "";
  output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = COutput::GetEffectiveValue(&output2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&output3,&local_480,0x438,1,2,&output4,"output2.GetEffectiveValue()",&nValue,"nValue");
  CMutableTransaction::GetHash((Txid *)&output5,&tx);
  output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = output5.fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
  output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = output5.fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
  output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _9_7_ = output5.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._9_7_;
  output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload =
       output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged =
       output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._9_7_ =
       output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._9_7_;
  output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(this_00,0);
  local_3d8 = 100000;
  uStack_3d0 = 1;
  feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._9_7_ = uStack_3cf;
  feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  pvVar3 = (iterator)0x94;
  pvVar4 = &DAT_00000001;
  feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)0x186a0;
  COutput::COutput(&output3,(COutPoint *)&output4,pvVar2,1,0x94,true,true,true,0,false,feerate_01);
  expected_ev3 = -0x12c0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43d;
  file_01.m_begin = (iterator)&local_498;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4a8,
             msg_01);
  output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ =
       output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._8_8_ & 0xffffffffffffff00;
  output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_011480b0;
  output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = (long)boost::unit_test::lazy_ostream::inst;
  output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4b0 = "";
  output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = COutput::GetEffectiveValue(&output3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&output4,&local_4b8,0x43d,1,2,&output5,"output3.GetEffectiveValue()",&expected_ev3,
             "expected_ev3");
  CMutableTransaction::GetHash((Txid *)&local_388,&tx);
  output5.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = local_378;
  output5.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = pcStack_370;
  output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload = local_388;
  output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ = uStack_380;
  output5.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  output5.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  output5.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  output5.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(this_00,0);
  pvVar3 = (iterator)0x94;
  pvVar4 = &DAT_00000001;
  COutput::COutput(&output4,(COutPoint *)&output5,pvVar2,1,0x94,true,true,true,0,false,0x94);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x442;
  file_02.m_begin = (iterator)&local_4c8;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4d8,
             msg_02);
  output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ =
       output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._8_8_ & 0xffffffffffffff00;
  output5.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_011480b0;
  output5.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = (long)boost::unit_test::lazy_ostream::inst;
  output5.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4e0 = "";
  local_388._M_value = COutput::GetEffectiveValue(&output4);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&output5,&local_4e8,0x442,1,2,&local_388,"output4.GetEffectiveValue()",&expected_ev1,
             "expected_ev1");
  CMutableTransaction::GetHash((Txid *)&local_3a8,&tx);
  local_378 = (_Storage<long,_true>)local_398;
  pcStack_370 = (char *)uStack_390;
  local_388 = local_3a8;
  uStack_380 = uStack_3a0;
  local_368 = 0;
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(this_00,0);
  pvVar3 = (iterator)0xffffffffffffffff;
  pvVar4 = &DAT_00000001;
  COutput::COutput(&output5,(COutPoint *)&local_388,pvVar2,1,-1,true,true,true,0,false,0);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x446;
  file_03.m_begin = (iterator)&local_4f8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_508,
             msg_03);
  uStack_380 = uStack_380 & 0xffffffffffffff00;
  local_388._M_value = (long)&PTR__lazy_ostream_011480b0;
  local_378._M_value = (long)boost::unit_test::lazy_ostream::inst;
  pcStack_370 = "";
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_510 = "";
  local_3a8._M_value = COutput::GetEffectiveValue(&output5);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_388,&local_518,0x446,1,2,&local_3a8,"output5.GetEffectiveValue()",&nValue,
             "nValue");
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output5.txout.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output4.txout.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output3.txout.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output2.txout.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output1.txout.scriptPubKey.super_CScriptBase);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(effective_value_test)
{
    const int input_bytes = 148;
    const CFeeRate feerate(1000);
    const CAmount nValue = 10000;
    const int nInput = 0;

    CMutableTransaction tx;
    tx.vout.resize(1);
    tx.vout[nInput].nValue = nValue;

    // standard case, pass feerate in constructor
    COutput output1(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    const CAmount expected_ev1 = 9852; // 10000 - 148
    BOOST_CHECK_EQUAL(output1.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass feerate in constructor
    COutput output2(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    BOOST_CHECK_EQUAL(output2.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1

    // negative effective value, pass feerate in constructor
    COutput output3(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, CFeeRate(100000));
    const CAmount expected_ev3 = -4800; // 10000 - 14800
    BOOST_CHECK_EQUAL(output3.GetEffectiveValue(), expected_ev3);

    // standard case, pass fees in constructor
    const CAmount fees = 148;
    COutput output4(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fees);
    BOOST_CHECK_EQUAL(output4.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass fees in constructor
    COutput output5(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, /*fees=*/ 0);
    BOOST_CHECK_EQUAL(output5.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1
}